

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O2

ILayer * __thiscall
DenseLifLayer::Backward(DenseLifLayer *this,vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  INeuron *pIVar2;
  pointer pfVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  int idx;
  ulong uVar8;
  pointer ppIVar9;
  long lVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar11;
  double __x;
  ulong uVar12;
  undefined1 auVar13 [16];
  float local_44;
  
  ppIVar9 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  fVar11 = 0.0;
  lVar10 = 0;
  local_44 = 0.0;
  for (; ppIVar9 != ppIVar1; ppIVar9 = ppIVar9 + 1) {
    pIVar2 = *ppIVar9;
    (*pIVar2->_vptr_INeuron[4])(pIVar2);
    local_44 = local_44 + extraout_XMM0_Da;
    iVar4 = INeuron::GetOutputSpikeCounter(pIVar2);
    lVar10 = lVar10 + (ulong)(0 < iVar4);
    (*pIVar2->_vptr_INeuron[0xb])(pIVar2);
    (*pIVar2->_vptr_INeuron[0xb])(pIVar2);
    fVar11 = (float)((1.0 / (double)extraout_XMM0_Da_00) / (double)extraout_XMM0_Da_01 +
                    (double)fVar11);
  }
  lVar5 = (long)(this->super_ILayer).neurons.
                super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_ILayer).neurons.
                super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar13._8_4_ = (int)(lVar5 >> 0x23);
  auVar13._0_8_ = lVar6;
  auVar13._12_4_ = 0x45300000;
  __x = (double)fVar11 /
        ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  if (__x < 0.0) {
    sqrt(__x);
  }
  for (uVar8 = 0; sVar7 = ILayer::GetSize(&this->super_ILayer), uVar8 < sVar7; uVar8 = uVar8 + 1) {
    pfVar3 = (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar3 == (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)(uint)pfVar3[uVar8];
    }
    pIVar2 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar8];
    (*pIVar2->_vptr_INeuron[7])
              ((ulong)(uint)local_44,uVar12,pIVar2,(this->super_ILayer).meta.size,lVar10);
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::Backward( const std::vector<float> &deltas )
{
    float totalLayerOutput = 0;
    size_t activeNeurons = 0;
    float meanReversedSquaredThresholds = 0;
    for ( auto neuron: neurons ) {
        totalLayerOutput += neuron->GetOutput();
        activeNeurons += neuron->GetOutputSpikeCounter() > 0;
        meanReversedSquaredThresholds += 1. / neuron->GetMaxMP() / neuron->GetMaxMP();
    }
    meanReversedSquaredThresholds = sqrt( 1. * meanReversedSquaredThresholds / neurons.size() );

    for ( int idx = 0; idx < GetSize(); ++idx ) {
        float delta = 0;
        if ( !deltas.empty()) {
            delta = deltas[idx];
        }
        neurons[idx]->Backward( totalLayerOutput, delta, meta.size, activeNeurons, meanReversedSquaredThresholds );
    }
    return *this;
}